

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O1

void duckdb::AllocatorFlushThresholdSetting::SetGlobal
               (DatabaseInstance *db,DBConfig *config,Value *input)

{
  idx_t iVar1;
  TaskScheduler *this;
  string local_38;
  
  Value::ToString_abi_cxx11_(&local_38,input);
  iVar1 = DBConfig::ParseMemoryLimit(&local_38);
  (config->options).allocator_flush_threshold = iVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  if (db != (DatabaseInstance *)0x0) {
    this = TaskScheduler::GetScheduler(db);
    TaskScheduler::SetAllocatorFlushTreshold(this,(config->options).allocator_flush_threshold);
  }
  return;
}

Assistant:

void AllocatorFlushThresholdSetting::SetGlobal(DatabaseInstance *db, DBConfig &config, const Value &input) {
	config.options.allocator_flush_threshold = DBConfig::ParseMemoryLimit(input.ToString());
	if (db) {
		TaskScheduler::GetScheduler(*db).SetAllocatorFlushTreshold(config.options.allocator_flush_threshold);
	}
}